

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  kj::
  HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>
  ::~HashMap(&this->connections);
  kj::TaskSet::~TaskSet(&this->tasks);
  kj::Own<capnp::_::(anonymous_namespace)::RpcSystemBrand,_std::nullptr_t>::~Own(&this->brand);
  kj::Promise<void>::~Promise(&this->acceptLoopPromise);
  kj::Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_>::~Maybe(&this->traceEncoder);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&this->bootstrapInterface);
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }